

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O3

void __thiscall Diligent::AsyncTaskBase::SetStatus(AsyncTaskBase *this,ASYNC_TASK_STATUS TaskStatus)

{
  string msg;
  string local_38;
  
  if ((this->m_TaskStatus)._M_i != TaskStatus) {
    switch(TaskStatus) {
    case ASYNC_TASK_STATUS_UNKNOWN:
      FormatString<char[27]>(&local_38,(char (*) [27])"UNKNOWN is invalid status.");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x6d);
      break;
    case ASYNC_TASK_STATUS_NOT_STARTED:
      if ((this->m_TaskStatus)._M_i == ASYNC_TASK_STATUS_RUNNING) goto LAB_001d3457;
      FormatString<char[69]>
                (&local_38,
                 (char (*) [69])
                 "A task should only be moved to NOT_STARTED state from RUNNING state.");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x72);
      break;
    case ASYNC_TASK_STATUS_RUNNING:
      if ((this->m_TaskStatus)._M_i == ASYNC_TASK_STATUS_NOT_STARTED) goto LAB_001d3457;
      FormatString<char[64]>
                (&local_38,
                 (char (*) [64])"A task should be moved to RUNNING state from NOT_STARTED state.");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x77);
      break;
    case ASYNC_TASK_STATUS_CANCELLED:
      if (((this->m_TaskStatus)._M_i == ASYNC_TASK_STATUS_NOT_STARTED) ||
         ((this->m_TaskStatus)._M_i == ASYNC_TASK_STATUS_RUNNING)) goto LAB_001d3457;
      FormatString<char[85]>
                (&local_38,
                 (char (*) [85])
                 "A task should be moved to CANCELLED state from either NOT_STARTED or RUNNING states."
                );
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x7d);
      break;
    case ASYNC_TASK_STATUS_COMPLETE:
      if ((this->m_TaskStatus)._M_i == ASYNC_TASK_STATUS_RUNNING) goto LAB_001d3457;
      FormatString<char[61]>
                (&local_38,
                 (char (*) [61])"A task should be moved to COMPLETE state from RUNNING state.");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x82);
      break;
    default:
      FormatString<char[23]>(&local_38,(char (*) [23])"Unexpected task status");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x86);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001d3457:
  LOCK();
  (this->m_TaskStatus)._M_i = TaskStatus;
  UNLOCK();
  return;
}

Assistant:

SetStatus(ASYNC_TASK_STATUS TaskStatus) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        if (TaskStatus != m_TaskStatus)
        {
            switch (TaskStatus)
            {
                case ASYNC_TASK_STATUS_UNKNOWN:
                    DEV_ERROR("UNKNOWN is invalid status.");
                    break;

                case ASYNC_TASK_STATUS_NOT_STARTED:
                    DEV_CHECK_ERR(m_TaskStatus == ASYNC_TASK_STATUS_RUNNING,
                                  "A task should only be moved to NOT_STARTED state from RUNNING state.");
                    break;

                case ASYNC_TASK_STATUS_RUNNING:
                    DEV_CHECK_ERR(m_TaskStatus == ASYNC_TASK_STATUS_NOT_STARTED,
                                  "A task should be moved to RUNNING state from NOT_STARTED state.");
                    break;

                case ASYNC_TASK_STATUS_CANCELLED:
                    DEV_CHECK_ERR((m_TaskStatus == ASYNC_TASK_STATUS_NOT_STARTED ||
                                   m_TaskStatus == ASYNC_TASK_STATUS_RUNNING),
                                  "A task should be moved to CANCELLED state from either NOT_STARTED or RUNNING states.");
                    break;

                case ASYNC_TASK_STATUS_COMPLETE:
                    DEV_CHECK_ERR(m_TaskStatus == ASYNC_TASK_STATUS_RUNNING,
                                  "A task should be moved to COMPLETE state from RUNNING state.");
                    break;

                default:
                    UNEXPECTED("Unexpected task status");
            }
        }
#endif
        m_TaskStatus.store(TaskStatus);
    }